

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::InstructionFolder::FoldBinaryIntegerOpToConstant
          (InstructionFolder *this,Instruction *inst,function<unsigned_int_(unsigned_int)> *id_map,
          uint32_t *result)

{
  Op OVar1;
  IRContext *this_00;
  ConstantManager *this_01;
  uint **ppuVar2;
  uint uVar3;
  int iVar4;
  uint32_t uVar5;
  int32_t iVar6;
  Operand *pOVar7;
  uint **ppuVar8;
  Constant *pCVar9;
  undefined4 extraout_var;
  uint32_t i;
  bool bVar11;
  long lVar12;
  bool bVar13;
  IntConstant *constants [2];
  ScalarConstant *local_48 [2];
  uint local_34;
  ScalarConstant *pSVar10;
  
  OVar1 = inst->opcode_;
  this_00 = this->context_;
  if ((this_00->valid_analyses_ & kAnalysisConstants) == kAnalysisNone) {
    IRContext::BuildConstantManager(this_00);
  }
  this_01 = (this_00->constant_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>._M_head_impl;
  lVar12 = 0;
  do {
    pOVar7 = Instruction::GetInOperand(inst,(uint32_t)lVar12);
    if (pOVar7->type != SPV_OPERAND_TYPE_ID) {
      return false;
    }
    ppuVar2 = (uint **)(pOVar7->words).large_data_._M_t.
                       super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       .
                       super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                       ._M_head_impl;
    ppuVar8 = &(pOVar7->words).small_data_;
    if (ppuVar2 != (uint **)0x0) {
      ppuVar8 = ppuVar2;
    }
    local_34 = **ppuVar8;
    if ((id_map->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    uVar3 = (*id_map->_M_invoker)((_Any_data *)id_map,&local_34);
    pCVar9 = analysis::ConstantManager::FindDeclaredConstant(this_01,uVar3);
    if (pCVar9 == (Constant *)0x0) {
      pSVar10 = (ScalarConstant *)0x0;
    }
    else {
      iVar4 = (*pCVar9->_vptr_Constant[0xe])(pCVar9);
      pSVar10 = (ScalarConstant *)CONCAT44(extraout_var,iVar4);
    }
    local_48[lVar12] = pSVar10;
    lVar12 = lVar12 + 1;
  } while (lVar12 == 1);
  switch(OVar1) {
  case OpUGreaterThan:
    if ((local_48[0] == (ScalarConstant *)0x0) ||
       (iVar4 = (*(local_48[0]->super_Constant)._vptr_Constant[0x17])(), (char)iVar4 == '\0')) {
      if (local_48[1] == (ScalarConstant *)0x0) {
        return false;
      }
      uVar5 = analysis::ScalarConstant::GetU32BitValue(local_48[1]);
      if (uVar5 != 0xffffffff) {
        return false;
      }
    }
    break;
  case OpSGreaterThan:
    if (local_48[0] != (ScalarConstant *)0x0) {
      analysis::IntConstant::GetS32BitValue((IntConstant *)local_48[0]);
    }
    if (local_48[1] == (ScalarConstant *)0x0) {
      return false;
    }
    iVar6 = analysis::IntConstant::GetS32BitValue((IntConstant *)local_48[1]);
    if (iVar6 != 0x7fffffff) {
      return false;
    }
    break;
  case OpUGreaterThanEqual:
    if ((local_48[0] == (ScalarConstant *)0x0) ||
       (uVar5 = analysis::ScalarConstant::GetU32BitValue(local_48[0]), uVar5 != 0xffffffff)) {
      if (local_48[1] == (ScalarConstant *)0x0) {
        return false;
      }
      uVar5 = analysis::ScalarConstant::GetU32BitValue(local_48[1]);
      if (uVar5 != 0) {
        return false;
      }
    }
    goto LAB_00573b50;
  case OpSGreaterThanEqual:
    if ((local_48[0] == (ScalarConstant *)0x0) ||
       (iVar6 = analysis::IntConstant::GetS32BitValue((IntConstant *)local_48[0]),
       iVar6 != 0x7fffffff)) {
      if (local_48[1] != (ScalarConstant *)0x0) {
        analysis::IntConstant::GetS32BitValue((IntConstant *)local_48[1]);
        return false;
      }
      return false;
    }
    goto LAB_00573b50;
  case OpULessThan:
    if ((local_48[0] == (ScalarConstant *)0x0) ||
       (uVar5 = analysis::ScalarConstant::GetU32BitValue(local_48[0]), uVar5 != 0xffffffff)) {
      if (local_48[1] == (ScalarConstant *)0x0) {
        return false;
      }
      uVar5 = analysis::ScalarConstant::GetU32BitValue(local_48[1]);
      if (uVar5 != 0) {
        return false;
      }
    }
    break;
  case OpSLessThan:
    if ((local_48[0] == (ScalarConstant *)0x0) ||
       (iVar6 = analysis::IntConstant::GetS32BitValue((IntConstant *)local_48[0]),
       iVar6 != 0x7fffffff)) {
      if (local_48[1] != (ScalarConstant *)0x0) {
        analysis::IntConstant::GetS32BitValue((IntConstant *)local_48[1]);
        return false;
      }
      return false;
    }
    break;
  case OpULessThanEqual:
    if ((local_48[0] == (ScalarConstant *)0x0) ||
       (iVar4 = (*(local_48[0]->super_Constant)._vptr_Constant[0x17])(), (char)iVar4 == '\0')) {
      if (local_48[1] == (ScalarConstant *)0x0) {
        return false;
      }
      uVar5 = analysis::ScalarConstant::GetU32BitValue(local_48[1]);
      if (uVar5 != 0xffffffff) {
        return false;
      }
    }
    goto LAB_00573b50;
  case OpSLessThanEqual:
    if (local_48[0] != (ScalarConstant *)0x0) {
      analysis::IntConstant::GetS32BitValue((IntConstant *)local_48[0]);
    }
    if (local_48[1] == (ScalarConstant *)0x0) {
      return false;
    }
    iVar6 = analysis::IntConstant::GetS32BitValue((IntConstant *)local_48[1]);
    if (iVar6 != 0x7fffffff) {
      return false;
    }
LAB_00573b50:
    *result = 1;
    return true;
  case OpFOrdEqual:
  case OpFUnordEqual:
  case OpFOrdNotEqual:
  case OpFUnordNotEqual:
  case OpFOrdLessThan:
  case OpFUnordLessThan:
  case OpFOrdGreaterThan:
  case OpFUnordGreaterThan:
  case OpFOrdLessThanEqual:
  case OpFUnordLessThanEqual:
  case OpFOrdGreaterThanEqual:
  case OpFUnordGreaterThanEqual:
  case OpIAdd|OpCopyMemorySized:
  case OpIAdd|OpAccessChain:
  case OpShiftRightArithmetic:
  case OpBitwiseXor:
    return false;
  case OpShiftRightLogical:
  case OpShiftLeftLogical:
    if (local_48[1] == (ScalarConstant *)0x0) {
      return false;
    }
    uVar5 = analysis::ScalarConstant::GetU32BitValue(local_48[1]);
    if (uVar5 < 0x20) {
      return false;
    }
    break;
  case OpBitwiseOr:
    lVar12 = 0;
    bVar13 = false;
    bVar11 = false;
    while ((local_48[lVar12] == (ScalarConstant *)0x0 ||
           (uVar5 = analysis::ScalarConstant::GetU32BitValue(local_48[lVar12]), uVar5 != 0xffffffff)
           )) {
      lVar12 = lVar12 + 1;
      bVar13 = lVar12 != 1;
      if (bVar13) {
LAB_0057398e:
        if (!bVar13) {
          return bVar11;
        }
        return false;
      }
    }
    *result = 0xffffffff;
    bVar11 = true;
    goto LAB_0057398e;
  case OpBitwiseAnd:
    lVar12 = 0;
    while ((local_48[lVar12] == (ScalarConstant *)0x0 ||
           (iVar4 = (*(local_48[lVar12]->super_Constant)._vptr_Constant[0x17])(),
           (char)iVar4 == '\0'))) {
      lVar12 = lVar12 + 1;
      if (lVar12 != 1) {
        return false;
      }
    }
    break;
  default:
    uVar3 = OVar1 - OpIMul;
    if (7 < uVar3) {
      return false;
    }
    if ((0xecU >> (uVar3 & 0x1f) & 1) == 0) {
      if (uVar3 != 0) {
        return false;
      }
      lVar12 = 0;
      while ((local_48[lVar12] == (ScalarConstant *)0x0 ||
             (iVar4 = (*(local_48[lVar12]->super_Constant)._vptr_Constant[0x17])(),
             (char)iVar4 == '\0'))) {
        lVar12 = lVar12 + 1;
        if (lVar12 != 1) {
          return false;
        }
      }
    }
    else {
      lVar12 = 0;
      while ((local_48[lVar12] == (ScalarConstant *)0x0 ||
             (iVar4 = (*(local_48[lVar12]->super_Constant)._vptr_Constant[0x17])(),
             (char)iVar4 == '\0'))) {
        lVar12 = lVar12 + 1;
        if (lVar12 != 1) {
          return false;
        }
      }
    }
  }
  *result = 0;
  return true;
}

Assistant:

bool InstructionFolder::FoldBinaryIntegerOpToConstant(
    Instruction* inst, const std::function<uint32_t(uint32_t)>& id_map,
    uint32_t* result) const {
  spv::Op opcode = inst->opcode();
  analysis::ConstantManager* const_manger = context_->get_constant_mgr();

  uint32_t ids[2];
  const analysis::IntConstant* constants[2];
  for (uint32_t i = 0; i < 2; i++) {
    const Operand* operand = &inst->GetInOperand(i);
    if (operand->type != SPV_OPERAND_TYPE_ID) {
      return false;
    }
    ids[i] = id_map(operand->words[0]);
    const analysis::Constant* constant =
        const_manger->FindDeclaredConstant(ids[i]);
    constants[i] = (constant != nullptr ? constant->AsIntConstant() : nullptr);
  }

  switch (opcode) {
    // Arthimetics
    case spv::Op::OpIMul:
      for (uint32_t i = 0; i < 2; i++) {
        if (constants[i] != nullptr && constants[i]->IsZero()) {
          *result = 0;
          return true;
        }
      }
      break;
    case spv::Op::OpUDiv:
    case spv::Op::OpSDiv:
    case spv::Op::OpSRem:
    case spv::Op::OpSMod:
    case spv::Op::OpUMod:
      // This changes undefined behaviour (ie divide by 0) into a 0.
      for (uint32_t i = 0; i < 2; i++) {
        if (constants[i] != nullptr && constants[i]->IsZero()) {
          *result = 0;
          return true;
        }
      }
      break;

    // Shifting
    case spv::Op::OpShiftRightLogical:
    case spv::Op::OpShiftLeftLogical:
      if (constants[1] != nullptr) {
        // When shifting by a value larger than the size of the result, the
        // result is undefined.  We are setting the undefined behaviour to a
        // result of 0.  If the shift amount is the same as the size of the
        // result, then the result is defined, and it 0.
        uint32_t shift_amount = constants[1]->GetU32BitValue();
        if (shift_amount >= 32) {
          *result = 0;
          return true;
        }
      }
      break;

    // Bitwise operations
    case spv::Op::OpBitwiseOr:
      for (uint32_t i = 0; i < 2; i++) {
        if (constants[i] != nullptr) {
          // TODO: Change the mask against a value based on the bit width of the
          // instruction result type.  This way we can handle say 16-bit values
          // as well.
          uint32_t mask = constants[i]->GetU32BitValue();
          if (mask == 0xFFFFFFFF) {
            *result = 0xFFFFFFFF;
            return true;
          }
        }
      }
      break;
    case spv::Op::OpBitwiseAnd:
      for (uint32_t i = 0; i < 2; i++) {
        if (constants[i] != nullptr) {
          if (constants[i]->IsZero()) {
            *result = 0;
            return true;
          }
        }
      }
      break;

    // Comparison
    case spv::Op::OpULessThan:
      if (constants[0] != nullptr &&
          constants[0]->GetU32BitValue() == UINT32_MAX) {
        *result = false;
        return true;
      }
      if (constants[1] != nullptr && constants[1]->GetU32BitValue() == 0) {
        *result = false;
        return true;
      }
      break;
    case spv::Op::OpSLessThan:
      if (constants[0] != nullptr &&
          constants[0]->GetS32BitValue() == INT32_MAX) {
        *result = false;
        return true;
      }
      if (constants[1] != nullptr &&
          constants[1]->GetS32BitValue() == INT32_MIN) {
        *result = false;
        return true;
      }
      break;
    case spv::Op::OpUGreaterThan:
      if (constants[0] != nullptr && constants[0]->IsZero()) {
        *result = false;
        return true;
      }
      if (constants[1] != nullptr &&
          constants[1]->GetU32BitValue() == UINT32_MAX) {
        *result = false;
        return true;
      }
      break;
    case spv::Op::OpSGreaterThan:
      if (constants[0] != nullptr &&
          constants[0]->GetS32BitValue() == INT32_MIN) {
        *result = false;
        return true;
      }
      if (constants[1] != nullptr &&
          constants[1]->GetS32BitValue() == INT32_MAX) {
        *result = false;
        return true;
      }
      break;
    case spv::Op::OpULessThanEqual:
      if (constants[0] != nullptr && constants[0]->IsZero()) {
        *result = true;
        return true;
      }
      if (constants[1] != nullptr &&
          constants[1]->GetU32BitValue() == UINT32_MAX) {
        *result = true;
        return true;
      }
      break;
    case spv::Op::OpSLessThanEqual:
      if (constants[0] != nullptr &&
          constants[0]->GetS32BitValue() == INT32_MIN) {
        *result = true;
        return true;
      }
      if (constants[1] != nullptr &&
          constants[1]->GetS32BitValue() == INT32_MAX) {
        *result = true;
        return true;
      }
      break;
    case spv::Op::OpUGreaterThanEqual:
      if (constants[0] != nullptr &&
          constants[0]->GetU32BitValue() == UINT32_MAX) {
        *result = true;
        return true;
      }
      if (constants[1] != nullptr && constants[1]->GetU32BitValue() == 0) {
        *result = true;
        return true;
      }
      break;
    case spv::Op::OpSGreaterThanEqual:
      if (constants[0] != nullptr &&
          constants[0]->GetS32BitValue() == INT32_MAX) {
        *result = true;
        return true;
      }
      if (constants[1] != nullptr &&
          constants[1]->GetS32BitValue() == INT32_MIN) {
        *result = true;
        return true;
      }
      break;
    default:
      break;
  }
  return false;
}